

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_builder_morton.cpp
# Opt level: O1

void __thiscall
embree::sse2::BVHNMeshBuilderMorton<4,_embree::Instance,_embree::InstancePrimitive>::build
          (BVHNMeshBuilderMorton<4,_embree::Instance,_embree::InstancePrimitive> *this)

{
  mvector<BVHBuilderMorton::BuildPrim> *morton;
  bool bVar1;
  uint uVar2;
  BVH *pBVar3;
  pointer ppTVar4;
  Device *pDVar5;
  Block *pBVar6;
  PrimRef *ptr;
  MemoryMonitorInterface *pMVar7;
  BuildPrim *pBVar8;
  __int_type_conflict _Var9;
  long lVar10;
  BuildPrim *pBVar11;
  ulong uVar12;
  size_t sVar13;
  ulong uVar14;
  __pointer_type pBVar15;
  pointer ppTVar16;
  ulong numPrimitives;
  EVP_PKEY_CTX *ctx;
  BVHNodeRecord<embree::NodeRefPtr<4>_> root;
  undefined1 local_111;
  size_t *local_110;
  CalculateMeshBounds<embree::Instance> local_108;
  BVH *local_100;
  FastAllocator *local_f8;
  BuildProgressMonitorInterface local_f0;
  CreateMortonLeaf<4,_embree::InstancePrimitive> local_e0;
  anon_union_16_2_47237d3f_for_Vec3fa_0 local_c8;
  size_t local_b8;
  size_t sStack_b0;
  size_t local_a8;
  FastAllocator **ppFStack_a0;
  undefined1 *local_98;
  BVH **ppBStack_90;
  CreateMortonLeaf<4,_embree::InstancePrimitive> *local_88;
  CalculateMeshBounds<embree::Instance> *local_80;
  BuildProgressMonitorInterface *local_78;
  undefined8 local_70;
  BVHNodeRecord<embree::NodeRefPtr<4>_> local_68;
  
  if ((this->mesh->super_Geometry).numPrimitives != this->numPreviousPrimitives) {
    pBVar3 = this->bvh;
    FastAllocator::internal_fix_used_blocks(&pBVar3->alloc);
    ppTVar4 = (pBVar3->alloc).thread_local_allocators.
              super__Vector_base<embree::FastAllocator::ThreadLocal2_*,_std::allocator<embree::FastAllocator::ThreadLocal2_*>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    for (ppTVar16 = (pBVar3->alloc).thread_local_allocators.
                    super__Vector_base<embree::FastAllocator::ThreadLocal2_*,_std::allocator<embree::FastAllocator::ThreadLocal2_*>_>
                    ._M_impl.super__Vector_impl_data._M_start; ppTVar16 != ppTVar4;
        ppTVar16 = ppTVar16 + 1) {
      FastAllocator::ThreadLocal2::unbind(*ppTVar16,&pBVar3->alloc);
    }
    ppTVar16 = (pBVar3->alloc).thread_local_allocators.
               super__Vector_base<embree::FastAllocator::ThreadLocal2_*,_std::allocator<embree::FastAllocator::ThreadLocal2_*>_>
               ._M_impl.super__Vector_impl_data._M_start;
    if ((pBVar3->alloc).thread_local_allocators.
        super__Vector_base<embree::FastAllocator::ThreadLocal2_*,_std::allocator<embree::FastAllocator::ThreadLocal2_*>_>
        ._M_impl.super__Vector_impl_data._M_finish != ppTVar16) {
      (pBVar3->alloc).thread_local_allocators.
      super__Vector_base<embree::FastAllocator::ThreadLocal2_*,_std::allocator<embree::FastAllocator::ThreadLocal2_*>_>
      ._M_impl.super__Vector_impl_data._M_finish = ppTVar16;
    }
    LOCK();
    (pBVar3->alloc).bytesUsed.super___atomic_base<unsigned_long>._M_i = 0;
    UNLOCK();
    LOCK();
    (pBVar3->alloc).bytesFree.super___atomic_base<unsigned_long>._M_i = 0;
    UNLOCK();
    LOCK();
    (pBVar3->alloc).bytesWasted.super___atomic_base<unsigned_long>._M_i = 0;
    UNLOCK();
    if ((pBVar3->alloc).usedBlocks._M_b._M_p != (__pointer_type)0x0) {
      pDVar5 = (pBVar3->alloc).device;
      bVar1 = (pBVar3->alloc).useUSM;
      pBVar15 = (pBVar3->alloc).usedBlocks._M_b._M_p;
      do {
        pBVar6 = pBVar15->next;
        FastAllocator::Block::clear_block(pBVar15,pDVar5,bVar1);
        pBVar15 = pBVar6;
      } while (pBVar6 != (Block *)0x0);
    }
    LOCK();
    (pBVar3->alloc).usedBlocks._M_b._M_p = (__pointer_type)0x0;
    UNLOCK();
    if ((pBVar3->alloc).freeBlocks._M_b._M_p != (__pointer_type)0x0) {
      pDVar5 = (pBVar3->alloc).device;
      bVar1 = (pBVar3->alloc).useUSM;
      pBVar15 = (pBVar3->alloc).freeBlocks._M_b._M_p;
      do {
        pBVar6 = pBVar15->next;
        FastAllocator::Block::clear_block(pBVar15,pDVar5,bVar1);
        pBVar15 = pBVar6;
      } while (pBVar6 != (Block *)0x0);
    }
    LOCK();
    (pBVar3->alloc).freeBlocks._M_b._M_p = (__pointer_type)0x0;
    UNLOCK();
    lVar10 = -8;
    do {
      LOCK();
      (pBVar3->alloc).threadBlocks[lVar10]._M_b._M_p = (__pointer_type)0x0;
      UNLOCK();
      LOCK();
      (pBVar3->alloc).threadBlocks[lVar10 + 8]._M_b._M_p = (__pointer_type)0x0;
      UNLOCK();
      lVar10 = lVar10 + 1;
    } while (lVar10 != 0);
    sVar13 = (pBVar3->alloc).primrefarray.size_alloced;
    ptr = (pBVar3->alloc).primrefarray.items;
    if (ptr != (PrimRef *)0x0) {
      if (sVar13 << 5 < 0x1c00000) {
        alignedFree(ptr);
      }
      else {
        os_free(ptr,sVar13 << 5,(pBVar3->alloc).primrefarray.alloc.hugepages);
      }
    }
    if (sVar13 != 0) {
      pMVar7 = (pBVar3->alloc).primrefarray.alloc.device;
      (**pMVar7->_vptr_MemoryMonitorInterface)(pMVar7,sVar13 * -0x20,1);
    }
    (pBVar3->alloc).primrefarray.size_active = 0;
    (pBVar3->alloc).primrefarray.size_alloced = 0;
    (pBVar3->alloc).primrefarray.items = (PrimRef *)0x0;
    sVar13 = (this->morton).size_alloced;
    pBVar8 = (this->morton).items;
    if (pBVar8 != (BuildPrim *)0x0) {
      if (sVar13 * 8 < 0x1c00000) {
        alignedFree(pBVar8);
      }
      else {
        os_free(pBVar8,sVar13 * 8,(this->morton).alloc.hugepages);
      }
    }
    if (sVar13 != 0) {
      pMVar7 = (this->morton).alloc.device;
      (**pMVar7->_vptr_MemoryMonitorInterface)(pMVar7,sVar13 * -8,1);
    }
    (this->morton).size_active = 0;
    (this->morton).size_alloced = 0;
    (this->morton).items = (BuildPrim *)0x0;
  }
  uVar2 = (this->mesh->super_Geometry).numPrimitives;
  numPrimitives = (ulong)uVar2;
  this->numPreviousPrimitives = uVar2;
  if (numPrimitives == 0) {
    local_c8._0_8_ = 0x7f8000007f800000;
    local_c8._8_8_ = 0x7f8000007f800000;
    local_b8 = 0xff800000ff800000;
    sStack_b0 = 0xff800000ff800000;
    local_a8 = 0x7f8000007f800000;
    ppFStack_a0 = (FastAllocator **)0x7f8000007f800000;
    local_98 = (undefined1 *)0xff800000ff800000;
    ppBStack_90 = (BVH **)0xff800000ff800000;
    BVHN<4>::set(this->bvh,(NodeRef)0x8,(LBBox3fa *)&local_c8.field_1,0);
  }
  else {
    uVar12 = (this->morton).size_alloced;
    uVar14 = uVar12;
    if ((uVar12 < numPrimitives) && (uVar14 = numPrimitives, uVar12 != 0)) {
      while (uVar14 = uVar12, uVar14 < numPrimitives) {
        uVar12 = uVar14 * 2 + (ulong)(uVar14 * 2 == 0);
      }
    }
    local_110 = &(this->morton).size_active;
    if (numPrimitives < (this->morton).size_active) {
      *local_110 = numPrimitives;
    }
    morton = &this->morton;
    if ((this->morton).size_alloced == uVar14) {
      *local_110 = numPrimitives;
    }
    else {
      pBVar8 = (this->morton).items;
      if (uVar14 != 0) {
        pMVar7 = (morton->alloc).device;
        (**pMVar7->_vptr_MemoryMonitorInterface)(pMVar7,uVar14 * 8,0);
      }
      uVar12 = uVar14 * 8;
      if (uVar12 < 0x1c00000) {
        pBVar11 = (BuildPrim *)alignedMalloc(uVar12,8);
      }
      else {
        pBVar11 = (BuildPrim *)os_malloc(uVar12,&(this->morton).alloc.hugepages);
      }
      (this->morton).items = pBVar11;
      if ((this->morton).size_active != 0) {
        uVar12 = 0;
        do {
          (this->morton).items[uVar12].field_0 = pBVar8[uVar12].field_0;
          uVar12 = uVar12 + 1;
        } while (uVar12 < (this->morton).size_active);
      }
      sVar13 = (this->morton).size_alloced;
      if (pBVar8 != (BuildPrim *)0x0) {
        if (sVar13 * 8 < 0x1c00000) {
          alignedFree(pBVar8);
        }
        else {
          os_free(pBVar8,sVar13 * 8,(this->morton).alloc.hugepages);
        }
      }
      if (sVar13 != 0) {
        pMVar7 = (morton->alloc).device;
        (**pMVar7->_vptr_MemoryMonitorInterface)(pMVar7,sVar13 * -8,1);
      }
      (this->morton).size_active = numPrimitives;
      (this->morton).size_alloced = uVar14;
    }
    FastAllocator::init(&this->bvh->alloc,(EVP_PKEY_CTX *)(numPrimitives * 8));
    pBVar15 = (this->bvh->alloc).freeBlocks._M_b._M_p;
    _Var9 = (pBVar15->cur).super___atomic_base<unsigned_long>._M_i;
    sVar13 = createMortonCodeArray<embree::Instance>
                       (this->mesh,morton,
                        &(this->bvh->scene->progressInterface).super_BuildProgressMonitor);
    local_100 = this->bvh;
    local_108.mesh = this->mesh;
    local_e0.geomID_ = this->geomID_;
    local_e0.morton = (this->morton).items;
    local_f8 = &local_100->alloc;
    local_78 = &local_f0;
    local_f0.super_BuildProgressMonitor._vptr_BuildProgressMonitor =
         (_func_int **)&PTR_operator___02202970;
    local_f0.scene = (local_100->scene->progressInterface).scene;
    local_88 = &local_e0;
    ppFStack_a0 = &local_f8;
    ppBStack_90 = &local_100;
    local_80 = &local_108;
    local_a8 = (this->settings).singleThreadThreshold;
    local_c8._0_8_ = (this->settings).branchingFactor;
    local_c8._8_8_ = (this->settings).maxDepth;
    local_b8 = (this->settings).minLeafSize;
    sStack_b0 = (this->settings).maxLeafSize;
    local_98 = &local_111;
    local_70 = 0;
    local_e0.mesh = local_108.mesh;
    BVHBuilderMorton::
    BuilderT<embree::BVHNodeRecord<embree::NodeRefPtr<4>_>,_embree::FastAllocator::CachedAllocator,_embree::BVHN<4>::CreateAlloc,_embree::AABBNode_t<embree::NodeRefPtr<4>,_4>::Create,_embree::sse2::SetBVHNBounds<4>,_embree::sse2::CreateMortonLeaf<4,_embree::InstancePrimitive>,_embree::sse2::CalculateMeshBounds<embree::Instance>,_embree::Scene::BuildProgressMonitorInterface>
    ::build(&local_68,
            (BuilderT<embree::BVHNodeRecord<embree::NodeRefPtr<4>_>,_embree::FastAllocator::CachedAllocator,_embree::BVHN<4>::CreateAlloc,_embree::AABBNode_t<embree::NodeRefPtr<4>,_4>::Create,_embree::sse2::SetBVHNBounds<4>,_embree::sse2::CreateMortonLeaf<4,_embree::InstancePrimitive>,_embree::sse2::CalculateMeshBounds<embree::Instance>,_embree::Scene::BuildProgressMonitorInterface>
             *)&local_c8.field_1,local_e0.morton,(BuildPrim *)(pBVar15->data + _Var9),sVar13);
    local_c8._0_8_ = local_68.bounds.lower.field_0._0_8_;
    local_c8._8_8_ = local_68.bounds.lower.field_0._8_8_;
    local_b8 = local_68.bounds.upper.field_0._0_8_;
    sStack_b0 = local_68.bounds.upper.field_0._8_8_;
    local_a8 = local_68.bounds.lower.field_0._0_8_;
    ppFStack_a0 = (FastAllocator **)local_68.bounds.lower.field_0._8_8_;
    local_98 = (undefined1 *)local_68.bounds.upper.field_0._0_8_;
    ppBStack_90 = (BVH **)local_68.bounds.upper.field_0._8_8_;
    BVHN<4>::set(this->bvh,(NodeRef)local_68.ref.ptr,(LBBox3fa *)&local_c8.field_1,numPrimitives);
    BVHNRotate<4>::rotate((NodeRef)(this->bvh->root).ptr,1);
    ctx = (EVP_PKEY_CTX *)&this->bvh->root;
    BVHN<4>::clearBarrier(this->bvh,(NodeRef *)ctx);
    if ((this->bvh->scene->scene_flags & RTC_SCENE_FLAG_DYNAMIC) == RTC_SCENE_FLAG_NONE) {
      sVar13 = (this->morton).size_alloced;
      pBVar8 = (this->morton).items;
      if (pBVar8 != (BuildPrim *)0x0) {
        ctx = (EVP_PKEY_CTX *)(sVar13 * 8);
        if (ctx < (EVP_PKEY_CTX *)0x1c00000) {
          alignedFree(pBVar8);
        }
        else {
          os_free(pBVar8,(size_t)ctx,(this->morton).alloc.hugepages);
        }
      }
      if (sVar13 != 0) {
        pMVar7 = (morton->alloc).device;
        ctx = (EVP_PKEY_CTX *)(sVar13 * -8);
        (**pMVar7->_vptr_MemoryMonitorInterface)(pMVar7,ctx,1);
      }
      *local_110 = 0;
      local_110[1] = 0;
      local_110[2] = 0;
    }
    BVHN<4>::cleanup(this->bvh,ctx);
  }
  return;
}

Assistant:

void build() 
      {
        /* we reset the allocator when the mesh size changed */
        if (mesh->numPrimitives != numPreviousPrimitives) {
          bvh->alloc.clear();
          morton.clear();
        }
        size_t numPrimitives = mesh->size();
        numPreviousPrimitives = numPrimitives;
        
        /* skip build for empty scene */
        if (numPrimitives == 0) {
          bvh->set(BVH::emptyNode,empty,0);
          return;
        }
        
        /* preallocate arrays */
        morton.resize(numPrimitives);
        size_t bytesEstimated = numPrimitives*sizeof(AABBNode)/(4*N) + size_t(1.2f*Primitive::blocks(numPrimitives)*sizeof(Primitive));
        size_t bytesMortonCodes = numPrimitives*sizeof(BVHBuilderMorton::BuildPrim);
        bytesEstimated = max(bytesEstimated,bytesMortonCodes); // the first allocation block is reused to sort the morton codes
        bvh->alloc.init(bytesMortonCodes,bytesMortonCodes,bytesEstimated);

        /* create morton code array */
        BVHBuilderMorton::BuildPrim* dest = (BVHBuilderMorton::BuildPrim*) bvh->alloc.specialAlloc(bytesMortonCodes);
        size_t numPrimitivesGen = createMortonCodeArray<Mesh>(mesh,morton,bvh->scene->progressInterface);

        /* create BVH */
        SetBVHNBounds<N> setBounds(bvh);
        CreateMortonLeaf<N,Primitive> createLeaf(mesh,geomID_,morton.data());
        CalculateMeshBounds<Mesh> calculateBounds(mesh);
        auto root = BVHBuilderMorton::build<NodeRecord>(
          typename BVH::CreateAlloc(bvh), 
          typename BVH::AABBNode::Create(),
          setBounds,createLeaf,calculateBounds,bvh->scene->progressInterface,
          morton.data(),dest,numPrimitivesGen,settings);
        
        bvh->set(root.ref,LBBox3fa(root.bounds),numPrimitives);
        
#if ROTATE_TREE
        if (N == 4)
        {
          for (int i=0; i<ROTATE_TREE; i++)
            BVHNRotate<N>::rotate(bvh->root);
          bvh->clearBarrier(bvh->root);
        }
#endif

        /* clear temporary data for static geometry */
        if (bvh->scene->isStaticAccel()) {
          morton.clear();
        }
        bvh->cleanup();
      }